

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Builder builder_00;
  Builder builder_01;
  size_t sVar1;
  int64_t iVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  undefined8 in_stack_fffffffffffffc40;
  size_t local_380;
  int local_378;
  bool local_371;
  undefined1 auStack_370 [7];
  bool _kj_shouldLog_2;
  Builder local_360;
  size_t local_338;
  int local_330;
  bool local_329;
  undefined1 local_328 [7];
  bool _kj_shouldLog_1;
  int64_t local_300;
  int local_2f8;
  bool local_2f1;
  undefined1 local_2f0 [7];
  bool _kj_shouldLog;
  Builder local_2c8;
  Builder local_2a0;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> local_278;
  undefined1 local_268 [8];
  TestInitMessageBuilder builder2;
  Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&> local_180;
  undefined1 local_178 [8];
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  int local_154;
  Fault local_150;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segs;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase93 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_100,1,FIXED_SIZE);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_128,(MessageBuilder *)local_100);
  builder_00._builder.capTable = (CapTableBuilder *)local_128._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_128._builder.capTable;
  builder_00._builder.data = local_128._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_128._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffc40;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc40 >> 0x30);
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  f.exception = (Exception *)AVar3.ptr;
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar1 == 1) {
    local_154 = 1;
    segInits.disposer =
         (ArrayDisposer *)
         kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                   ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x67,FAILED,"(1) != (segs.size())","1, segs.size()",&local_154,
               (unsigned_long *)&segInits.disposer);
    kj::_::Debug::Fault::fatal(&local_150);
  }
  kj::_::Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&>::Mapper
            (&local_180,(ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  kj::_::Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_message_test_c__:105:19)>
            ((Array<capnp::MessageBuilder::SegmentInit> *)local_178,&local_180,
             (anon_class_1_0_00000001 *)((long)&builder2.allocations.builder.disposer + 7));
  local_278 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_178);
  TestInitMessageBuilder::TestInitMessageBuilder((TestInitMessageBuilder *)local_268,local_278);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2a0,(MessageBuilder *)local_268);
  builder_01._builder.capTable = (CapTableBuilder *)local_2a0._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_2a0._builder.capTable;
  builder_01._builder.data = local_2a0._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_2a0._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffc40;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc40 >> 0x30);
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2c8,(MessageBuilder *)local_268);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64Field(&local_2c8,0x1e1b9);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_2f0,(MessageBuilder *)local_100);
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field((Builder *)local_2f0);
  if (iVar2 != 0x1e1b9) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      local_2f8 = 0x1e1b9;
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                ((Builder *)local_328,(MessageBuilder *)local_100);
      local_300 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                            ((Builder *)local_328);
      kj::_::Debug::log<char_const(&)[79],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 &local_2f8,&local_300);
      local_2f1 = false;
    }
  }
  sVar1 = kj::Vector<kj::Array<capnp::word>_>::size
                    ((Vector<kj::Array<capnp::word>_> *)
                     &builder2.super_MessageBuilder.allocatedArena);
  if (sVar1 != 0) {
    local_329 = kj::_::Debug::shouldLog(ERROR);
    while (local_329 != false) {
      local_330 = 0;
      local_338 = kj::Vector<kj::Array<capnp::word>_>::size
                            ((Vector<kj::Array<capnp::word>_> *)
                             &builder2.super_MessageBuilder.allocatedArena);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",&local_330,
                 &local_338);
      local_329 = false;
    }
  }
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_360,(MessageBuilder *)local_268);
  Text::Reader::Reader((Reader *)auStack_370,"foobarbaz");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_360,(Reader)_auStack_370);
  sVar1 = kj::Vector<kj::Array<capnp::word>_>::size
                    ((Vector<kj::Array<capnp::word>_> *)
                     &builder2.super_MessageBuilder.allocatedArena);
  if (sVar1 != 1) {
    local_371 = kj::_::Debug::shouldLog(ERROR);
    while (local_371 != false) {
      local_378 = 1;
      local_380 = kj::Vector<kj::Array<capnp::word>_>::size
                            ((Vector<kj::Array<capnp::word>_> *)
                             &builder2.super_MessageBuilder.allocatedArena);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"(1) == (builder2.allocations.size())\", 1, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",&local_378,
                 &local_380);
      local_371 = false;
    }
  }
  TestInitMessageBuilder::~TestInitMessageBuilder((TestInitMessageBuilder *)local_268);
  kj::Array<capnp::MessageBuilder::SegmentInit>::~Array
            ((Array<capnp::MessageBuilder::SegmentInit> *)local_178);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}